

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O0

bool test_Player_reinforce(bool verbose)

{
  bool bVar1;
  int iVar2;
  GameLoop *pGVar3;
  vector<Player_*,_std::allocator<Player_*>_> *pvVar4;
  reference ppPVar5;
  vector<CardType,_std::allocator<CardType>_> *pvVar6;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar7;
  reference ppCVar8;
  reference ppCVar9;
  ostream *poVar10;
  string local_a0;
  string local_70;
  Country *local_50;
  Country *c;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  int numArmiesC1;
  value_type local_24 [3];
  Hand *local_18;
  Hand *pHand;
  bool success;
  bool verbose_local;
  
  pHand._6_1_ = 1;
  pHand._7_1_ = verbose;
  GameLoop::startSingle(true);
  pGVar3 = GameLoop::getInstance();
  pvVar4 = GameLoop::getAllPlayers(pGVar3);
  ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar4,0);
  local_18 = Player::getCards(*ppPVar5);
  pvVar6 = Hand::getHand(local_18);
  local_24[2] = 2;
  std::vector<CardType,_std::allocator<CardType>_>::push_back(pvVar6,local_24 + 2);
  pvVar6 = Hand::getHand(local_18);
  local_24[1] = 2;
  std::vector<CardType,_std::allocator<CardType>_>::push_back(pvVar6,local_24 + 1);
  pvVar6 = Hand::getHand(local_18);
  local_24[0] = CAVALRY;
  std::vector<CardType,_std::allocator<CardType>_>::push_back(pvVar6,local_24);
  pvVar6 = Hand::getHand(local_18);
  numArmiesC1 = 2;
  std::vector<CardType,_std::allocator<CardType>_>::push_back(pvVar6,(value_type *)&numArmiesC1);
  pvVar6 = Hand::getHand(local_18);
  __range2._4_4_ = 2;
  std::vector<CardType,_std::allocator<CardType>_>::push_back
            (pvVar6,(value_type *)((long)&__range2 + 4));
  pGVar3 = GameLoop::getInstance();
  pvVar4 = GameLoop::getAllPlayers(pGVar3);
  ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar4,0);
  pvVar7 = Player::getOwnedCountries(*ppPVar5);
  ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar7,0);
  __range2._0_4_ = Map::Country::getNumberOfTroops(*ppCVar8);
  pGVar3 = GameLoop::getInstance();
  pvVar4 = GameLoop::getAllPlayers(pGVar3);
  ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar4,0);
  iVar2 = Player::reinforce(*ppPVar5);
  if (iVar2 == -1) {
    pHand._6_1_ = 0;
  }
  if ((pHand._7_1_ & 1) != 0) {
    pGVar3 = GameLoop::getInstance();
    pvVar4 = GameLoop::getAllPlayers(pGVar3);
    ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar4,0);
    pvVar7 = Player::getOwnedCountries(*ppPVar5);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar7);
    c = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar7);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                       *)&c), bVar1) {
      ppCVar9 = __gnu_cxx::
                __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                ::operator*(&__end2);
      local_50 = *ppCVar9;
      std::operator<<((ostream *)&std::cout,"\x1b[35m");
      poVar10 = std::operator<<((ostream *)&std::cout,"player1\'s ");
      Map::Country::getCountryName_abi_cxx11_(&local_70,local_50);
      poVar10 = std::operator<<(poVar10,(string *)&local_70);
      poVar10 = std::operator<<(poVar10," had ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)__range2);
      poVar10 = std::operator<<(poVar10," armies");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_70);
      poVar10 = std::operator<<((ostream *)&std::cout,"player1\'s ");
      Map::Country::getCountryName_abi_cxx11_(&local_a0,local_50);
      poVar10 = std::operator<<(poVar10,(string *)&local_a0);
      poVar10 = std::operator<<(poVar10," now has ");
      iVar2 = Map::Country::getNumberOfTroops(local_50);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
      poVar10 = std::operator<<(poVar10," armies");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_a0);
      std::operator<<((ostream *)&std::cout,"\x1b[31m");
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
  }
  GameLoop::resetInstance();
  return (bool)(pHand._6_1_ & 1);
}

Assistant:

bool test_Player_reinforce(bool verbose = false) {

    // Arrange
    bool success = true;
    GameLoop::startSingle(true);
    Hand* pHand = GameLoop::getInstance()->getAllPlayers()->at(0)->getCards();
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);

    int numArmiesC1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getNumberOfTroops();

    if (GameLoop::getInstance()->getAllPlayers()->at(0)->reinforce() == PlayerAction::FAILED) {
        success = false;
    }

    if (verbose) {
        for (auto* c: *GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()) {
            std::cout << "\033[35m";
            std::cout << "player1's " << c->getCountryName() << " had " << numArmiesC1 << " armies" << std::endl;
            std::cout << "player1's " << c->getCountryName() << " now has " << c->getNumberOfTroops()
                      << " armies" << std::endl;
            std::cout << "\033[31m";
        }
    }
    GameLoop::resetInstance();
    return success;
}